

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::optimizePowerOf2URem<unsigned_int>
          (OptimizeInstructions *this,Binary *binary,uint c)

{
  Const *pCVar1;
  Literal local_38;
  uint local_1c;
  Binary *pBStack_18;
  uint c_local;
  Binary *binary_local;
  OptimizeInstructions *this_local;
  
  binary->op = AndInt32;
  local_1c = c;
  pBStack_18 = binary;
  binary_local = (Binary *)this;
  wasm::Literal::Literal(&local_38,c - 1);
  pCVar1 = Expression::cast<wasm::Const>(pBStack_18->right);
  wasm::Literal::operator=(&pCVar1->value,&local_38);
  wasm::Literal::~Literal(&local_38);
  return (Expression *)pBStack_18;
}

Assistant:

Expression* optimizePowerOf2URem(Binary* binary, T c) {
    static_assert(std::is_same<T, uint32_t>::value ||
                    std::is_same<T, uint64_t>::value,
                  "type mismatch");
    binary->op = std::is_same<T, uint32_t>::value ? AndInt32 : AndInt64;
    binary->right->cast<Const>()->value = Literal(c - 1);
    return binary;
  }